

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O1

void __thiscall
google::protobuf::internal::InternalMetadataWithArena::DoClear(InternalMetadataWithArena *this)

{
  void *pvVar1;
  UnknownFieldSet *this_00;
  
  pvVar1 = (this->
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ).ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    this_00 = InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ::mutable_unknown_fields_slow
                        (&this->
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        );
  }
  else {
    this_00 = (UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  if ((this_00->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this_00->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    UnknownFieldSet::ClearFallback(this_00);
    return;
  }
  return;
}

Assistant:

void DoClear() { mutable_unknown_fields()->Clear(); }